

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jidctint.c
# Opt level: O0

void jpeg_idct_6x6(j_decompress_ptr cinfo,jpeg_component_info *compptr,JCOEFPTR coef_block,
                  JSAMPARRAY output_buf,JDIMENSION output_col)

{
  JSAMPLE *pJVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  JSAMPROW pJVar11;
  long lVar12;
  long lVar13;
  JSAMPLE local_138 [8];
  int workspace [36];
  int ctr;
  JSAMPLE *range_limit;
  JSAMPROW outptr;
  int *wsptr;
  ISLOW_MULT_TYPE *quantptr;
  JCOEFPTR inptr;
  INT32 z3;
  INT32 z2;
  INT32 z1;
  INT32 tmp12;
  INT32 tmp11;
  INT32 tmp10;
  INT32 tmp2;
  INT32 tmp1;
  INT32 tmp0;
  JDIMENSION output_col_local;
  JSAMPARRAY output_buf_local;
  JCOEFPTR coef_block_local;
  jpeg_component_info *compptr_local;
  j_decompress_ptr cinfo_local;
  
  pJVar1 = cinfo->sample_range_limit;
  wsptr = (int *)compptr->dct_table;
  outptr = local_138;
  quantptr = (ISLOW_MULT_TYPE *)coef_block;
  for (workspace[0x23] = 0; workspace[0x23] < 6; workspace[0x23] = workspace[0x23] + 1) {
    lVar5 = (long)((int)(short)*quantptr * *wsptr) * 0x2000 + 0x400;
    lVar6 = (long)((int)(short)quantptr[0x10] * wsptr[0x20]);
    lVar7 = lVar5 + lVar6 * 0x16a1;
    lVar8 = (long)((int)(short)quantptr[8] * wsptr[0x10]);
    lVar9 = lVar7 + lVar8 * 0x2731;
    lVar7 = lVar7 + lVar8 * -0x2731;
    iVar2 = (int)(short)quantptr[4] * wsptr[8];
    iVar3 = (int)(short)quantptr[0xc] * wsptr[0x18];
    iVar4 = (int)(short)quantptr[0x14] * wsptr[0x28];
    lVar10 = ((long)iVar2 + (long)iVar4) * 0xbb6;
    lVar8 = lVar10 + ((long)iVar2 + (long)iVar3) * 0x2000;
    lVar10 = lVar10 + ((long)iVar4 - (long)iVar3) * 0x2000;
    iVar4 = (iVar2 - iVar3) - iVar4;
    *(int *)outptr = (int)(lVar9 + lVar8 >> 0xb);
    *(int *)(outptr + 0x78) = (int)(lVar9 - lVar8 >> 0xb);
    iVar2 = (int)(lVar5 + lVar6 * -0x16a1 + lVar6 * -0x16a1 >> 0xb);
    *(int *)(outptr + 0x18) = iVar2 + iVar4 * 4;
    *(int *)(outptr + 0x60) = iVar2 + iVar4 * -4;
    *(int *)(outptr + 0x30) = (int)(lVar7 + lVar10 >> 0xb);
    *(int *)(outptr + 0x48) = (int)(lVar7 - lVar10 >> 0xb);
    quantptr = (ISLOW_MULT_TYPE *)((long)quantptr + 2);
    wsptr = wsptr + 1;
    outptr = outptr + 4;
  }
  outptr = local_138;
  for (workspace[0x23] = 0; workspace[0x23] < 6; workspace[0x23] = workspace[0x23] + 1) {
    pJVar11 = output_buf[workspace[0x23]] + output_col;
    lVar5 = ((long)*(int *)outptr + 0x10) * 0x2000;
    lVar6 = (long)*(int *)(outptr + 0x10);
    lVar8 = lVar5 + lVar6 * 0x16a1;
    lVar5 = lVar5 + lVar6 * -0x16a1 + lVar6 * -0x16a1;
    lVar6 = lVar8 + (long)*(int *)(outptr + 8) * 0x2731;
    lVar8 = lVar8 + (long)*(int *)(outptr + 8) * -0x2731;
    lVar9 = (long)*(int *)(outptr + 4);
    lVar7 = (long)*(int *)(outptr + 0xc);
    lVar12 = (long)*(int *)(outptr + 0x14);
    lVar13 = (lVar9 + lVar12) * 0xbb6;
    lVar10 = lVar13 + (lVar9 + lVar7) * 0x2000;
    lVar13 = lVar13 + (lVar12 - lVar7) * 0x2000;
    lVar12 = (lVar9 - lVar7) - lVar12;
    *pJVar11 = pJVar1[(long)(int)((uint)(lVar6 + lVar10 >> 0x12) & 0x3ff) + 0x80];
    pJVar11[5] = pJVar1[(long)(int)((uint)(lVar6 - lVar10 >> 0x12) & 0x3ff) + 0x80];
    pJVar11[1] = pJVar1[(long)(int)((uint)(lVar5 + lVar12 * 0x2000 >> 0x12) & 0x3ff) + 0x80];
    pJVar11[4] = pJVar1[(long)(int)((uint)(lVar5 + lVar12 * -0x2000 >> 0x12) & 0x3ff) + 0x80];
    pJVar11[2] = pJVar1[(long)(int)((uint)(lVar8 + lVar13 >> 0x12) & 0x3ff) + 0x80];
    pJVar11[3] = pJVar1[(long)(int)((uint)(lVar8 - lVar13 >> 0x12) & 0x3ff) + 0x80];
    outptr = outptr + 0x18;
  }
  return;
}

Assistant:

GLOBAL(void)
jpeg_idct_6x6 (j_decompress_ptr cinfo, jpeg_component_info * compptr,
	       JCOEFPTR coef_block,
	       JSAMPARRAY output_buf, JDIMENSION output_col)
{
  INT32 tmp0, tmp1, tmp2, tmp10, tmp11, tmp12;
  INT32 z1, z2, z3;
  JCOEFPTR inptr;
  ISLOW_MULT_TYPE * quantptr;
  int * wsptr;
  JSAMPROW outptr;
  JSAMPLE *range_limit = IDCT_range_limit(cinfo);
  int ctr;
  int workspace[6*6];	/* buffers data between passes */
  SHIFT_TEMPS

  /* Pass 1: process columns from input, store into work array. */

  inptr = coef_block;
  quantptr = (ISLOW_MULT_TYPE *) compptr->dct_table;
  wsptr = workspace;
  for (ctr = 0; ctr < 6; ctr++, inptr++, quantptr++, wsptr++) {
    /* Even part */

    tmp0 = DEQUANTIZE(inptr[DCTSIZE*0], quantptr[DCTSIZE*0]);
    tmp0 <<= CONST_BITS;
    /* Add fudge factor here for final descale. */
    tmp0 += ONE << (CONST_BITS-PASS1_BITS-1);
    tmp2 = DEQUANTIZE(inptr[DCTSIZE*4], quantptr[DCTSIZE*4]);
    tmp10 = MULTIPLY(tmp2, FIX(0.707106781));   /* c4 */
    tmp1 = tmp0 + tmp10;
    tmp11 = RIGHT_SHIFT(tmp0 - tmp10 - tmp10, CONST_BITS-PASS1_BITS);
    tmp10 = DEQUANTIZE(inptr[DCTSIZE*2], quantptr[DCTSIZE*2]);
    tmp0 = MULTIPLY(tmp10, FIX(1.224744871));   /* c2 */
    tmp10 = tmp1 + tmp0;
    tmp12 = tmp1 - tmp0;

    /* Odd part */

    z1 = DEQUANTIZE(inptr[DCTSIZE*1], quantptr[DCTSIZE*1]);
    z2 = DEQUANTIZE(inptr[DCTSIZE*3], quantptr[DCTSIZE*3]);
    z3 = DEQUANTIZE(inptr[DCTSIZE*5], quantptr[DCTSIZE*5]);
    tmp1 = MULTIPLY(z1 + z3, FIX(0.366025404)); /* c5 */
    tmp0 = tmp1 + ((z1 + z2) << CONST_BITS);
    tmp2 = tmp1 + ((z3 - z2) << CONST_BITS);
    tmp1 = (z1 - z2 - z3) << PASS1_BITS;

    /* Final output stage */

    wsptr[6*0] = (int) RIGHT_SHIFT(tmp10 + tmp0, CONST_BITS-PASS1_BITS);
    wsptr[6*5] = (int) RIGHT_SHIFT(tmp10 - tmp0, CONST_BITS-PASS1_BITS);
    wsptr[6*1] = (int) (tmp11 + tmp1);
    wsptr[6*4] = (int) (tmp11 - tmp1);
    wsptr[6*2] = (int) RIGHT_SHIFT(tmp12 + tmp2, CONST_BITS-PASS1_BITS);
    wsptr[6*3] = (int) RIGHT_SHIFT(tmp12 - tmp2, CONST_BITS-PASS1_BITS);
  }

  /* Pass 2: process 6 rows from work array, store into output array. */

  wsptr = workspace;
  for (ctr = 0; ctr < 6; ctr++) {
    outptr = output_buf[ctr] + output_col;

    /* Even part */

    /* Add fudge factor here for final descale. */
    tmp0 = (INT32) wsptr[0] + (ONE << (PASS1_BITS+2));
    tmp0 <<= CONST_BITS;
    tmp2 = (INT32) wsptr[4];
    tmp10 = MULTIPLY(tmp2, FIX(0.707106781));   /* c4 */
    tmp1 = tmp0 + tmp10;
    tmp11 = tmp0 - tmp10 - tmp10;
    tmp10 = (INT32) wsptr[2];
    tmp0 = MULTIPLY(tmp10, FIX(1.224744871));   /* c2 */
    tmp10 = tmp1 + tmp0;
    tmp12 = tmp1 - tmp0;

    /* Odd part */

    z1 = (INT32) wsptr[1];
    z2 = (INT32) wsptr[3];
    z3 = (INT32) wsptr[5];
    tmp1 = MULTIPLY(z1 + z3, FIX(0.366025404)); /* c5 */
    tmp0 = tmp1 + ((z1 + z2) << CONST_BITS);
    tmp2 = tmp1 + ((z3 - z2) << CONST_BITS);
    tmp1 = (z1 - z2 - z3) << CONST_BITS;

    /* Final output stage */

    outptr[0] = range_limit[(int) RIGHT_SHIFT(tmp10 + tmp0,
					      CONST_BITS+PASS1_BITS+3)
			    & RANGE_MASK];
    outptr[5] = range_limit[(int) RIGHT_SHIFT(tmp10 - tmp0,
					      CONST_BITS+PASS1_BITS+3)
			    & RANGE_MASK];
    outptr[1] = range_limit[(int) RIGHT_SHIFT(tmp11 + tmp1,
					      CONST_BITS+PASS1_BITS+3)
			    & RANGE_MASK];
    outptr[4] = range_limit[(int) RIGHT_SHIFT(tmp11 - tmp1,
					      CONST_BITS+PASS1_BITS+3)
			    & RANGE_MASK];
    outptr[2] = range_limit[(int) RIGHT_SHIFT(tmp12 + tmp2,
					      CONST_BITS+PASS1_BITS+3)
			    & RANGE_MASK];
    outptr[3] = range_limit[(int) RIGHT_SHIFT(tmp12 - tmp2,
					      CONST_BITS+PASS1_BITS+3)
			    & RANGE_MASK];

    wsptr += 6;		/* advance pointer to next row */
  }
}